

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double folded_normal_cdf_inv(double cdf,double a,double b)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double mu;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 in_XMM1_Qb;
  double local_68;
  undefined8 uStack_60;
  double local_40;
  double local_30;
  double local_28;
  undefined8 uStack_20;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    local_28 = 0.0;
    if ((cdf != 0.0) || (dVar2 = local_28, NAN(cdf))) {
      if ((cdf != 1.0) || (NAN(cdf))) {
        mu = -a;
        auVar4._8_4_ = (int)in_XMM1_Qb;
        auVar4._0_8_ = mu;
        auVar4._12_4_ = (uint)((ulong)in_XMM1_Qb >> 0x20) ^ 0x80000000;
        dVar2 = normal_cdf_inv(cdf,(double)(~-(ulong)(a < mu) & (ulong)a |
                                           (ulong)mu & -(ulong)(a < mu)),b);
        local_40 = r8_max(dVar2,0.0);
        local_30 = folded_normal_cdf(local_40,a,b);
        dVar2 = (1.0 - cdf) * 0.5;
        dVar3 = normal_cdf_inv(dVar2,a,b);
        auVar1._8_4_ = extraout_XMM0_Dc;
        auVar1._0_8_ = dVar3;
        auVar1._12_4_ = extraout_XMM0_Dd;
        dVar2 = normal_cdf_inv(dVar2,mu,b);
        local_68 = r8_max(ABS(dVar3),ABS(dVar2));
        uStack_60 = auVar1._8_8_;
        folded_normal_cdf(local_68,a,b);
        local_28 = (local_40 + local_68) * 0.5;
        uStack_20 = auVar4._8_8_;
        dVar3 = folded_normal_cdf(local_28,a,b);
        uVar8 = SUB84(dVar3,0);
        uVar9 = (undefined4)((ulong)dVar3 >> 0x20);
        dVar2 = local_28;
        if (0.0001 <= ABS(dVar3 - cdf)) {
          iVar6 = 0x65;
          do {
            auVar1 = _local_68;
            iVar6 = iVar6 + -1;
            if (iVar6 == 0) {
              std::operator<<((ostream *)&std::cerr," \n");
              std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CDF_INV - Fatal error!\n");
              poVar5 = std::operator<<((ostream *)&std::cerr,"  Iteration limit IT_MAX = ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,100);
              pcVar7 = " exceeded.\n";
              goto LAB_0019d5ff;
            }
            if ((((double)CONCAT44(uVar9,uVar8) <= cdf) && (local_30 <= cdf)) ||
               ((cdf <= (double)CONCAT44(uVar9,uVar8) && (cdf <= local_30)))) {
              local_30 = (double)CONCAT44(uVar9,uVar8);
              local_40 = local_28;
            }
            else {
              local_68._0_4_ = local_28._0_4_;
              local_68._4_4_ = local_28._4_4_;
            }
            uStack_60 = auVar1._8_8_;
            dVar2 = (local_40 + (double)CONCAT44(local_68._4_4_,local_68._0_4_)) * 0.5;
            local_28 = dVar2;
            dVar3 = folded_normal_cdf(dVar2,a,b);
            uVar8 = SUB84(dVar3,0);
            uVar9 = (undefined4)((ulong)dVar3 >> 0x20);
          } while (0.0001 <= ABS(dVar3 - cdf));
        }
      }
      else {
        local_28 = 1e+30;
        dVar2 = local_28;
      }
    }
    local_28 = dVar2;
    return local_28;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CDF_INV - Fatal error!\n");
  pcVar7 = "  CDF < 0 or 1 < CDF.\n";
  poVar5 = (ostream *)&std::cerr;
LAB_0019d5ff:
  std::operator<<(poVar5,pcVar7);
  exit(1);
}

Assistant:

double folded_normal_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_CDF_INV inverts the Folded Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, double FOLDED_NORMAL_CDF_INV, the argument of the CDF.
//    0.0 <= X.
//
{
  double cdf1;
  double cdf2;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_huge = 1.0E+30;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;
  double xa;
  double xb;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "FOLDED_NORMAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = 0.0;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = r8_huge;
    return x;
  }
//
//  Find X1, for which the value of CDF will be too small.
//
  if ( 0.0 <= a )
  {
    x1 = normal_cdf_inv ( cdf, a, b );
  }
  else
  {
    x1 = normal_cdf_inv ( cdf, -a, b );
  }
  x1 = r8_max ( x1, 0.0 );
  cdf1 = folded_normal_cdf ( x1, a, b );
//
//  Find X2, for which the value of CDF will be too big.
//
  cdf2 = ( 1.0 - cdf ) / 2.0;

  xa = normal_cdf_inv ( cdf2, a, b );
  xb = normal_cdf_inv ( cdf2, -a, b );
  x2 = r8_max ( fabs ( xa ), fabs ( xb ) );
  cdf2 = folded_normal_cdf ( x2, a, b );
//
//  Now use bisection.
//
  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    x3 = 0.5 * ( x1 + x2 );
    cdf3 = folded_normal_cdf ( x3, a, b );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      break;
    }

    if ( it_max < it )
    {
      cerr << " \n";
      cerr << "FOLDED_NORMAL_CDF_INV - Fatal error!\n";
      cerr << "  Iteration limit IT_MAX = " << it_max << " exceeded.\n";
      exit ( 1 );
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
      cdf2 = cdf3;
    }
  }

  return x;
}